

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEigenAnalysis.cpp
# Opt level: O2

void __thiscall TPZEigenAnalysis::AssembleT<std::complex<double>>(TPZEigenAnalysis *this)

{
  TPZReference *pTVar1;
  TPZCompMesh *pTVar2;
  ostream *poVar3;
  TPZStructMatrix *pTVar4;
  TPZEigenSolver<std::complex<double>_> *pTVar5;
  long *plVar6;
  _Base_ptr p_Var7;
  long lVar8;
  long lVar9;
  TPZMatrix<std::complex<double>_> *pTVar10;
  anon_class_1_0_00000001 PardisoConfig;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> mat_1;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> mat;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> local_288;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> local_280;
  TPZAutoPointer<TPZGuiInterface> local_278;
  TPZAutoPointer<TPZGuiInterface> local_270;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> local_268;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> local_260;
  TPZAutoPointer<TPZGuiInterface> local_258;
  TPZAutoPointer<TPZGuiInterface> local_250;
  TPZFMatrix<std::complex<double>_> dummyRhs;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> matA;
  ostream local_1a8 [376];
  
  TPZFMatrix<std::complex<double>_>::TPZFMatrix(&dummyRhs);
  if ((this->super_TPZAnalysis).fCompMesh == (TPZCompMesh *)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&matA);
    std::operator<<(local_1a8,"void TPZEigenAnalysis::AssembleT() [TVar = std::complex<double>]");
    std::operator<<(local_1a8,"\nNo computational mesh found!\n");
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<((ostream *)&std::cout,(char *)mat.fRef);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&mat);
    std::__cxx11::stringstream::~stringstream((stringstream *)&matA);
  }
  else {
    pTVar1 = (this->super_TPZAnalysis).fStructMatrix.fRef;
    if ((pTVar1 == (TPZReference *)0x0) ||
       (pTVar4 = pTVar1->fPointer, pTVar4 == (TPZStructMatrix *)0x0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "Setting default struct matrix: skyline(non-symmetric)");
      std::endl<char,std::char_traits<char>>(poVar3);
      TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>::
      TPZSkylineNSymStructMatrix
                ((TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
                  *)&matA,(this->super_TPZAnalysis).fCompMesh);
      TPZAnalysis::SetStructuralMatrix(&this->super_TPZAnalysis,(TPZStructMatrix *)&matA);
      TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>::
      ~TPZSkylineNSymStructMatrix
                ((TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
                  *)&matA);
      pTVar4 = ((this->super_TPZAnalysis).fStructMatrix.fRef)->fPointer;
    }
    *(undefined1 *)((long)&pTVar4->fMesh + *(long *)(*(long *)pTVar4 + -0x60) + 4) = 0;
    EigenSolver<std::complex<double>>(this);
    pTVar4 = ((this->super_TPZAnalysis).fStructMatrix.fRef)->fPointer;
    lVar9 = (&(pTVar4->fEquationFilter).fNumEq)[(ulong)(pTVar4->fEquationFilter).fIsActive * 4];
    pTVar5 = EigenSolver<std::complex<double>>(this);
    if (pTVar5->fIsGeneralised == true) {
      pTVar2 = (this->super_TPZAnalysis).fCompMesh;
      for (p_Var7 = (pTVar2->fMaterialVec)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 != &(pTVar2->fMaterialVec)._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        if (p_Var7[1]._M_parent == (_Base_ptr)0x0) {
LAB_01108302:
          std::operator<<((ostream *)&std::cerr,
                          "void TPZEigenAnalysis::AssembleT() [TVar = std::complex<double>]");
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "\nERROR: cannot solve generalised EVP if\n");
          poVar3 = std::operator<<(poVar3,"the materials do not have the interface:\n");
          poVar3 = std::operator<<(poVar3,"TPZMatGeneralisedEigenVal\n");
          std::operator<<(poVar3,"Aborting...\n");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Analysis/TPZEigenAnalysis.cpp"
                     ,0xa5);
        }
        plVar6 = (long *)__dynamic_cast(p_Var7[1]._M_parent,&TPZMaterial::typeinfo,
                                        &TPZMatGeneralisedEigenVal::typeinfo,0xfffffffffffffffe);
        if (plVar6 == (long *)0x0) goto LAB_01108302;
        (**(code **)(*plVar6 + 0x48))(plVar6);
      }
    }
    matA.fRef = (pTVar5->fMatrixA).fRef;
    LOCK();
    ((matA.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((matA.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (((matA.fRef == (TPZReference *)0x0) ||
        (pTVar10 = (matA.fRef)->fPointer, pTVar10 == (TPZMatrix<std::complex<double>_> *)0x0)) ||
       ((pTVar10->super_TPZBaseMatrix).fRow != lVar9)) {
      local_258.fRef = (this->super_TPZAnalysis).fGuiInterface.fRef;
      pTVar4 = ((this->super_TPZAnalysis).fStructMatrix.fRef)->fPointer;
      lVar8 = *(long *)(*(long *)pTVar4 + -0x60);
      LOCK();
      ((local_258.fRef)->fCounter).super___atomic_base<int>._M_i =
           ((local_258.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      lVar8 = (**(code **)(*(long *)((long)&pTVar4->field_0x0 + lVar8) + 0x68))
                        ((long)&pTVar4->field_0x0 + lVar8);
      if (lVar8 == 0) {
        pTVar10 = (TPZMatrix<std::complex<double>_> *)0x0;
      }
      else {
        pTVar10 = (TPZMatrix<std::complex<double>_> *)
                  __dynamic_cast(lVar8,&TPZBaseMatrix::typeinfo,
                                 &TPZMatrix<std::complex<double>>::typeinfo,0);
      }
      TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::TPZAutoPointer(&mat,pTVar10);
      TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_258);
      local_260.fRef = mat.fRef;
      LOCK();
      ((mat.fRef)->fCounter).super___atomic_base<int>._M_i =
           ((mat.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::operator=(&pTVar5->fMatrixA,&local_260);
      TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer(&local_260);
      TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer(&mat);
    }
    else {
      (*(pTVar10->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xf])();
      local_250.fRef = (this->super_TPZAnalysis).fGuiInterface.fRef;
      pTVar4 = ((this->super_TPZAnalysis).fStructMatrix.fRef)->fPointer;
      lVar8 = *(long *)(*(long *)pTVar4 + -0x60);
      pTVar10 = (matA.fRef)->fPointer;
      LOCK();
      ((local_250.fRef)->fCounter).super___atomic_base<int>._M_i =
           ((local_250.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      (**(code **)(*(long *)((long)&pTVar4->field_0x0 + lVar8) + 0x48))
                ((long)&pTVar4->field_0x0 + lVar8,pTVar10,&dummyRhs);
      TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_250);
    }
    local_268.fRef = (pTVar5->fMatrixA).fRef;
    LOCK();
    ((local_268.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_268.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    AssembleT<std::complex<double>_>::anon_class_1_0_00000001::operator()(&PardisoConfig,&local_268)
    ;
    TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer(&local_268);
    if (pTVar5->fIsGeneralised == true) {
      pTVar2 = (this->super_TPZAnalysis).fCompMesh;
      for (p_Var7 = (pTVar2->fMaterialVec)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 != &(pTVar2->fMaterialVec)._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        if (p_Var7[1]._M_parent == (_Base_ptr)0x0) {
LAB_011085bd:
          std::operator<<((ostream *)&std::cerr,
                          "void TPZEigenAnalysis::AssembleT() [TVar = std::complex<double>]");
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "\nERROR: cannot solve generalised EVP if\n");
          poVar3 = std::operator<<(poVar3,"the materials do not have the interface:\n");
          poVar3 = std::operator<<(poVar3,"TPZMatGeneralisedEigenVal\n");
          std::operator<<(poVar3,"Aborting...\n");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Analysis/TPZEigenAnalysis.cpp"
                     ,0xc2);
        }
        plVar6 = (long *)__dynamic_cast(p_Var7[1]._M_parent,&TPZMaterial::typeinfo,
                                        &TPZMatGeneralisedEigenVal::typeinfo,0xfffffffffffffffe);
        if (plVar6 == (long *)0x0) goto LAB_011085bd;
        (**(code **)(*plVar6 + 0x50))(plVar6);
      }
      mat.fRef = (pTVar5->fMatrixB).fRef;
      LOCK();
      ((mat.fRef)->fCounter).super___atomic_base<int>._M_i =
           ((mat.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      if (((mat.fRef == (TPZReference *)0x0) ||
          (pTVar10 = (mat.fRef)->fPointer, pTVar10 == (TPZMatrix<std::complex<double>_> *)0x0)) ||
         ((pTVar10->super_TPZBaseMatrix).fRow != lVar9)) {
        local_278.fRef = (this->super_TPZAnalysis).fGuiInterface.fRef;
        pTVar4 = ((this->super_TPZAnalysis).fStructMatrix.fRef)->fPointer;
        lVar9 = *(long *)(*(long *)pTVar4 + -0x60);
        LOCK();
        ((local_278.fRef)->fCounter).super___atomic_base<int>._M_i =
             ((local_278.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
        UNLOCK();
        lVar9 = (**(code **)(*(long *)((long)&pTVar4->field_0x0 + lVar9) + 0x68))
                          ((long)&pTVar4->field_0x0 + lVar9);
        if (lVar9 == 0) {
          pTVar10 = (TPZMatrix<std::complex<double>_> *)0x0;
        }
        else {
          pTVar10 = (TPZMatrix<std::complex<double>_> *)
                    __dynamic_cast(lVar9,&TPZBaseMatrix::typeinfo,
                                   &TPZMatrix<std::complex<double>>::typeinfo,0);
        }
        TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::TPZAutoPointer(&mat_1,pTVar10);
        TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_278);
        local_280.fRef = mat_1.fRef;
        LOCK();
        ((mat_1.fRef)->fCounter).super___atomic_base<int>._M_i =
             ((mat_1.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
        UNLOCK();
        TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::operator=(&pTVar5->fMatrixB,&local_280);
        TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer(&local_280);
        TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer(&mat_1);
      }
      else {
        (*(pTVar10->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xf])();
        local_270.fRef = (this->super_TPZAnalysis).fGuiInterface.fRef;
        pTVar4 = ((this->super_TPZAnalysis).fStructMatrix.fRef)->fPointer;
        lVar9 = *(long *)(*(long *)pTVar4 + -0x60);
        pTVar10 = (mat.fRef)->fPointer;
        LOCK();
        ((local_270.fRef)->fCounter).super___atomic_base<int>._M_i =
             ((local_270.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
        UNLOCK();
        (**(code **)(*(long *)((long)&pTVar4->field_0x0 + lVar9) + 0x48))
                  ((long)&pTVar4->field_0x0 + lVar9,pTVar10,&dummyRhs);
        TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_270);
      }
      local_288.fRef = (pTVar5->fMatrixB).fRef;
      LOCK();
      ((local_288.fRef)->fCounter).super___atomic_base<int>._M_i =
           ((local_288.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      AssembleT<std::complex<double>_>::anon_class_1_0_00000001::operator()
                (&PardisoConfig,&local_288);
      TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer(&local_288);
      TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer(&mat);
    }
    TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer(&matA);
  }
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&dummyRhs);
  return;
}

Assistant:

void TPZEigenAnalysis::AssembleT()
{
  //this lambda will be used to prevent pardiso for disturbing pivots
  auto PardisoConfig = [](TPZAutoPointer<TPZMatrix<TVar>> mat){
    auto ssp = TPZAutoPointerDynamicCast<TPZSYsmpMatrix<TVar>>(mat);
    auto sp = TPZAutoPointerDynamicCast<TPZFYsmpMatrix<TVar>>(mat);
    TPZPardisoSolver<TVar> *pardiso{nullptr};
    if(ssp){
      pardiso = &(ssp->GetPardisoControl());
    }else if(sp){
      pardiso = &(sp->GetPardisoControl());
    }
    if(pardiso){
      auto param = pardiso->GetParam();
      //do not perturb pivot elements
      param[0] = 0;
    }
  };
  
  //it wont be resized or anything.
  TPZFMatrix<TVar> dummyRhs;
  if (!fCompMesh) {
    std::stringstream sout;
    sout << __PRETTY_FUNCTION__;
    sout << "\nNo computational mesh found!\n";
#ifdef PZ_LOG
    LOGPZ_ERROR(logger, sout.str().c_str());
#else
    std::cout << sout.str().c_str() << std::endl;
#endif
    return;
  }
  if (!this->fStructMatrix) {
#ifdef USING_MKL
    std::cout << "Setting default struct matrix: sparse(non-symmetric)"
              << std::endl;
    TPZSpStructMatrix<TVar> defaultMatrix(fCompMesh);
#else
    std::cout << "Setting default struct matrix: skyline(non-symmetric)"
              << std::endl;
    TPZSkylineNSymStructMatrix<TVar> defaultMatrix(fCompMesh);
#endif
    this->SetStructuralMatrix(defaultMatrix);
  }
  
  fStructMatrix->SetComputeRhs(false);
  
  {
    auto *eigSolver = &(this->EigenSolver<TVar>()); 
    if (!eigSolver) {
      std::cout << "Setting default solver: Krylov" << std::endl;
      constexpr int nev{10};
      constexpr int dimKrylov{100};
      TPZKrylovEigenSolver<TVar> defaultSolver;
      defaultSolver.SetNEigenpairs(nev);
      defaultSolver.SetKrylovDim(dimKrylov);
      std::cout << "Setting nev: " << nev << std::endl;
      std::cout << "Setting krylov dim: " << dimKrylov << std::endl;
      this->SetSolver(defaultSolver);
    }
  }
  
  const auto sz = fStructMatrix->EquationFilter().NActiveEquations();
  auto &eigSolver = this->EigenSolver<TVar>();
  if (eigSolver.IsGeneralised()) {
    
    
    auto &materialVec = fCompMesh->MaterialVec();
    for (auto &&item : materialVec) {
      auto mat = (item.second);
      auto eigmat = dynamic_cast<TPZMatGeneralisedEigenVal *>(mat);
      if (eigmat)
        eigmat->SetMatrixA();
      else {
        PZError << __PRETTY_FUNCTION__;
        PZError << "\nERROR: cannot solve generalised EVP if\n"
                << "the materials do not have the interface:\n"
                << "TPZMatGeneralisedEigenVal\n"
                << "Aborting...\n";
        DebugStop();
      }
    }
  }
  auto matA = eigSolver.MatrixA();
  if (matA && matA->Rows() == sz) {
    matA->Zero();
    fStructMatrix->Assemble(*matA, dummyRhs, fGuiInterface);
  } else {
    TPZAutoPointer<TPZMatrix<TVar>> mat =
      dynamic_cast<TPZMatrix<TVar>*>(
          fStructMatrix->CreateAssemble(dummyRhs, fGuiInterface));
    eigSolver.SetMatrixA(mat);
  }
  PardisoConfig(eigSolver.MatrixA());
  // fSolver->UpdateFrom(fSolver->MatrixA());
  if (eigSolver.IsGeneralised()) {
    auto &materialVec = fCompMesh->MaterialVec();
    for (auto &&item : materialVec) {
      auto mat = (item.second);
      auto eigmat = dynamic_cast<TPZMatGeneralisedEigenVal *>(mat);
      if (eigmat)
        eigmat->SetMatrixB();
      else {
        PZError << __PRETTY_FUNCTION__;
        PZError << "\nERROR: cannot solve generalised EVP if\n"
                << "the materials do not have the interface:\n"
                << "TPZMatGeneralisedEigenVal\n"
                << "Aborting...\n";
        DebugStop();
      }
    }
    auto matB = eigSolver.MatrixB();
    if (matB && matB->Rows() == sz) {
      matB->Zero();
      fStructMatrix->Assemble(*matB, dummyRhs, fGuiInterface);
    } else {
      TPZAutoPointer<TPZMatrix<TVar>> mat =
        dynamic_cast<TPZMatrix<TVar>*>(
          fStructMatrix->CreateAssemble(dummyRhs, fGuiInterface));
      eigSolver.SetMatrixB(mat);
    }
    PardisoConfig(eigSolver.MatrixB());
  }
}